

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O3

ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *match,ZydisRegisterWidth reg_width)

{
  undefined6 in_register_00000032;
  
  if (0xff < (uint)CONCAT62(in_register_00000032,reg_width)) {
    __assert_fail("reg_width <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x2b5,
                  "ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *, ZydisRegisterWidth)");
  }
  if (match->easz != 0) {
    return match->easz == reg_width;
  }
  if ((reg_width == 0x10) && (match->request->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
    return '\0';
  }
  match->easz = (ZyanU8)reg_width;
  return '\x01';
}

Assistant:

static ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *match, ZydisRegisterWidth reg_width)
{
    ZYAN_ASSERT(reg_width <= ZYAN_UINT8_MAX);
    if (match->easz == 0)
    {
        if ((match->request->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
            (reg_width == 16))
        {
            return ZYAN_FALSE;
        }
        match->easz = (ZyanU8)reg_width;
        return ZYAN_TRUE;
    }

    return match->easz == (ZyanU8)reg_width ? ZYAN_TRUE : ZYAN_FALSE;
}